

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O1

RK_S32 __thiscall mpp_list::del_at_tail(mpp_list *this,void *data,RK_S32 size)

{
  mpp_list_node *__ptr;
  mpp_list_node *pmVar1;
  mpp_list_node *pmVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  
  if (this->head == (mpp_list_node *)0x0) {
    return -0x16;
  }
  if (this->count == 0) {
    return -0x16;
  }
  __ptr = this->head->prev;
  pmVar1 = __ptr->prev;
  pmVar2 = __ptr->next;
  pmVar2->prev = pmVar1;
  pmVar1->next = pmVar2;
  __ptr->next = __ptr;
  __ptr->prev = __ptr;
  if (__ptr->size == size) {
    if (data == (void *)0x0) goto LAB_0016e3e1;
  }
  else {
    _mpp_log_l(2,"mpp_list","node size check failed when release_list",(char *)0x0,in_R8,in_R9,
               0xffffffea);
    if (data == (void *)0x0) goto LAB_0016e3e1;
    if (__ptr->size < size) {
      size = __ptr->size;
    }
  }
  memcpy(data,__ptr + 1,(long)size);
LAB_0016e3e1:
  free(__ptr);
  this->count = this->count + -1;
  return 0;
}

Assistant:

RK_S32 mpp_list::del_at_tail(void *data, RK_S32 size)
{
    RK_S32 ret = -EINVAL;
    if (head && count) {
        _list_del_node_no_lock(head->prev, data, size);
        count--;
        ret = 0;
    }
    return ret;
}